

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyMultiDrawAttribs(MultiDrawAttribs *Attribs)

{
  undefined *puVar1;
  Char *Message;
  undefined8 uVar2;
  char (*in_R8) [26];
  undefined1 local_60 [8];
  string _msg;
  undefined1 local_30 [8];
  string msg;
  MultiDrawAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if ((Attribs->DrawCount != 0) && (Attribs->pDrawItems == (MultiDrawItem *)0x0)) {
    FormatString<char[14],unsigned_int,char[26]>
              ((string *)local_30,(Diligent *)"DrawCount is ",(char (*) [14])Attribs,
               (uint *)", but pDrawItems is null.",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"VerifyMultiDrawAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xdc);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (*(int *)(msg.field_2._8_8_ + 0x14) == 0) {
    FormatString<char[110]>
              ((string *)local_60,
               (char (*) [110])
               "MultiDrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return true;
}

Assistant:

bool VerifyMultiDrawAttribs(const MultiDrawAttribs& Attribs)
{
    DEV_CHECK_ERR(Attribs.DrawCount == 0 || Attribs.pDrawItems != nullptr, "DrawCount is ", Attribs.DrawCount, ", but pDrawItems is null.");

    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("MultiDrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    return true;
}